

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_asm.cpp
# Opt level: O0

string * qpBasisStatusToString_abi_cxx11_(BasisStatus qp_basis_status)

{
  undefined4 in_ESI;
  string *in_RDI;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  switch(in_ESI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Inactive",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Active at lower bound",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Active at upper bound",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Inactive in basis",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Unidentified QP basis status",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
  }
  return in_RDI;
}

Assistant:

std::string qpBasisStatusToString(const BasisStatus qp_basis_status) {
  switch (qp_basis_status) {
    case BasisStatus::kInactive:
      return "Inactive";
    case BasisStatus::kActiveAtLower:
      return "Active at lower bound";
    case BasisStatus::kActiveAtUpper:
      return "Active at upper bound";
    case BasisStatus::kInactiveInBasis:
      return "Inactive in basis";
    default:
      return "Unidentified QP basis status";
  }
}